

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

size_t rtosc_bundle_elements(char *buffer,size_t len)

{
  uint32_t uVar1;
  uint8_t *arg_pos;
  size_t sVar2;
  
  arg_pos = (uint8_t *)(buffer + 0x10);
  sVar2 = 0;
  while( true ) {
    if (len <= (ulong)((long)arg_pos - (long)buffer)) {
      return sVar2;
    }
    uVar1 = extract_uint32(arg_pos);
    if (uVar1 == 0) break;
    arg_pos = arg_pos + (ulong)(uVar1 & 0xfffffffc) + 4;
    if (len < (ulong)((long)arg_pos - (long)buffer)) {
      return sVar2;
    }
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

size_t rtosc_bundle_elements(const char *buffer, size_t len)
{
    const uint32_t *lengths = (const uint32_t*) (buffer+16);
    size_t elms = 0;
    while(POS < len && extract_uint32((const uint8_t*)lengths)) {
        lengths += extract_uint32((const uint8_t*)lengths)/4+1;

        if(POS > len)
            break;
        ++elms;
    }
    return elms;
}